

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginElemExpr
          (BinaryReaderIR *this,Index elem_index,Index expr_index)

{
  value_type pEVar1;
  Result RVar2;
  size_type sVar3;
  reference ppEVar4;
  reference expr;
  ElemSegment *segment;
  Index expr_index_local;
  Index elem_index_local;
  BinaryReaderIR *this_local;
  
  sVar3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                    (&this->module_->elem_segments);
  if ((ulong)elem_index != sVar3 - 1) {
    __assert_fail("elem_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                  ,0x59b,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemExpr(Index, Index)"
                 );
  }
  ppEVar4 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::operator[]
                      (&this->module_->elem_segments,(ulong)elem_index);
  pEVar1 = *ppEVar4;
  sVar3 = std::
          vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
          ::size(&pEVar1->elem_exprs);
  if (expr_index == sVar3) {
    std::
    vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>::
    emplace_back<>(&pEVar1->elem_exprs);
    expr = std::
           vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ::back(&pEVar1->elem_exprs);
    RVar2 = BeginInitExpr(this,expr);
    return (Result)RVar2.enum_;
  }
  __assert_fail("expr_index == segment->elem_exprs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x59d,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginElemExpr(Index elem_index, Index expr_index) {
  assert(elem_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[elem_index];
  assert(expr_index == segment->elem_exprs.size());
  segment->elem_exprs.emplace_back();
  return BeginInitExpr(&segment->elem_exprs.back());
}